

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_ssadd32_mips(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  ulong oprsz;
  ulong uVar3;
  uint uVar4;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar3 = 0; uVar3 < oprsz; uVar3 = uVar3 + 4) {
    uVar2 = *(uint *)((long)a + uVar3);
    uVar1 = *(uint *)((long)b + uVar3) + uVar2;
    uVar4 = ((int)uVar1 >> 0x1f) + 0x80000000;
    if (-1 < (int)((uVar1 ^ uVar2) & ~(uVar2 ^ *(uint *)((long)b + uVar3)))) {
      uVar4 = uVar1;
    }
    *(uint *)((long)d + uVar3) = uVar4;
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_add8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        *(uint8_t *)((char *)d + i) = *(uint8_t *)((char *)a + i) + *(uint8_t *)((char *)b + i);
    }
    clear_high(d, oprsz, desc);
}